

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCentroidCount
          (VClient *this,string *i_rCameraName,uint *o_rCount)

{
  bool bVar1;
  VCameraInfo *pVVar2;
  VCentroids *pVVar3;
  Enum EVar4;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_2c;
  unique_lock<boost::recursive_mutex> local_28;
  
  local_28.m = &this->m_FrameMutex;
  local_28.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_28);
  local_2c = Success;
  ClientUtils::Clear(o_rCount);
  bVar1 = InitGet(this,&local_2c);
  if (bVar1) {
    pVVar2 = GetCamera(this,i_rCameraName,&local_2c);
    if (pVVar2 == (VCameraInfo *)0x0) {
      o_rCount = (uint *)(ulong)local_2c;
    }
    else {
      pVVar3 = GetCentroidSet(this,pVVar2->m_CameraID,&local_2c);
      if (pVVar3 != (VCentroids *)0x0) {
        *o_rCount = (uint)((ulong)((long)(pVVar3->m_Centroids).
                                         super__Vector_base<ViconCGStreamDetail::VCentroids_Centroid,_std::allocator<ViconCGStreamDetail::VCentroids_Centroid>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pVVar3->m_Centroids).
                                        super__Vector_base<ViconCGStreamDetail::VCentroids_Centroid,_std::allocator<ViconCGStreamDetail::VCentroids_Centroid>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5);
      }
    }
    EVar4 = (Enum)o_rCount;
    if (pVVar2 == (VCameraInfo *)0x0) goto LAB_001302e4;
  }
  EVar4 = local_2c;
LAB_001302e4:
  if (local_28.is_locked == true) {
    boost::recursive_mutex::unlock(local_28.m);
  }
  return EVar4;
}

Assistant:

Result::Enum VClient::GetCentroidCount( const std::string & i_rCameraName, unsigned int & o_rCount ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if( InitGet( GetResult, o_rCount ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    const ViconCGStream::VCentroids* pCentroidSet = GetCentroidSet( pCamera->m_CameraID, GetResult );
    if( pCentroidSet )
    {
      o_rCount = static_cast< unsigned int >( pCentroidSet->m_Centroids.size() );
    }
  }
  return GetResult;
}